

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAux.h
# Opt level: O1

void __thiscall BamTools::CustomHeaderTag::~CustomHeaderTag(CustomHeaderTag *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->TagValue)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->TagValue).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->TagName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->TagName).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

struct API_EXPORT CustomHeaderTag
{
    std::string TagName;
    std::string TagValue;
}